

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void Am_Connection::Wait_For_Connect(void)

{
  uint __i;
  long lVar1;
  timeval select_timeout;
  fd_set read_fd;
  
  select_timeout.tv_sec = 1;
  select_timeout.tv_usec = 0;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    read_fd.fds_bits[lVar1] = 0;
  }
  read_fd.fds_bits[m_parent_socket / 0x40] =
       read_fd.fds_bits[m_parent_socket / 0x40] | 1L << ((byte)m_parent_socket & 0x3f);
  select(m_parent_socket + 1,(fd_set *)&read_fd,(fd_set *)0x0,(fd_set *)0x0,
         (timeval *)&select_timeout);
  if (((ulong)read_fd.fds_bits[m_parent_socket / 0x40] >> ((long)m_parent_socket % 0x40 & 0x3fU) & 1
      ) != 0) {
    Handle_Sockets(&read_fd);
  }
  return;
}

Assistant:

void
Am_Connection::Wait_For_Connect(void)
{
  struct timeval select_timeout;
  select_timeout.tv_sec = 1;
  select_timeout.tv_usec = 0;

  fd_set read_fd;
  int nfds;
  FD_ZERO(&read_fd);
  FD_SET(m_parent_socket, &read_fd);

  nfds = m_parent_socket + 1;

  (void)select(nfds, &read_fd, nullptr, nullptr, &select_timeout);

  if (FD_ISSET(m_parent_socket, &read_fd))
    Am_Connection::Handle_Sockets(&read_fd);
}